

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump-filter.c
# Opt level: O3

void add_filter(codadump_filter **filter,codadump_filter *new_filter)

{
  codadump_filter *pcVar1;
  int iVar2;
  codadump_filter *local_18;
  
  do {
    local_18 = new_filter;
    if (filter == (codadump_filter **)0x0) {
      __assert_fail("filter != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codadump/codadump-filter.c"
                    ,0x75,"void add_filter(codadump_filter **, codadump_filter *)");
    }
    pcVar1 = *filter;
    if (pcVar1 == (codadump_filter *)0x0) break;
    iVar2 = strcmp(pcVar1->fieldname,new_filter->fieldname);
    if (iVar2 == 0) {
      if (pcVar1->subfilter != (codadump_filter *)0x0) {
        if (new_filter->subfilter == (codadump_filter *)0x0) {
          codadump_filter_remove(&pcVar1->subfilter);
        }
        else {
          add_filter(&pcVar1->subfilter,new_filter->subfilter);
          new_filter->subfilter = (codadump_filter *)0x0;
        }
      }
      codadump_filter_remove(&local_18);
      return;
    }
    filter = &pcVar1->next;
  } while (pcVar1->next != (codadump_filter *)0x0);
  *filter = new_filter;
  return;
}

Assistant:

static void add_filter(codadump_filter **filter, codadump_filter *new_filter)
{
    assert(filter != NULL);

    if (new_filter == NULL)
    {
        return;
    }

    if (*filter == NULL)
    {
        *filter = new_filter;
        return;
    }

    if (strcmp((*filter)->fieldname, new_filter->fieldname) == 0)
    {
        if ((*filter)->subfilter != NULL)
        {
            if (new_filter->subfilter != NULL)
            {
                add_filter(&(*filter)->subfilter, new_filter->subfilter);
                new_filter->subfilter = NULL;
            }
            else
            {
                codadump_filter_remove(&(*filter)->subfilter);
            }
        }
        codadump_filter_remove(&new_filter);
        return;
    }
    else if ((*filter)->next != NULL)
    {
        add_filter(&(*filter)->next, new_filter);
    }
    else
    {
        (*filter)->next = new_filter;
    }
}